

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CursorFirst(Fts5FullTable *pTab,Fts5Cursor *pCsr,int bDesc)

{
  Fts5Expr *p;
  int iVar1;
  int iVar2;
  int in_EDX;
  Fts5Cursor *in_RSI;
  Fts5Index *in_RDI;
  Fts5Expr *unaff_retaddr;
  Fts5Expr *pExpr;
  int rc;
  
  p = in_RSI->pExpr;
  iVar1 = sqlite3Fts5ExprFirst(unaff_retaddr,in_RDI,(i64)in_RSI,in_EDX);
  iVar2 = sqlite3Fts5ExprEof(p);
  if (iVar2 != 0) {
    in_RSI->csrflags = in_RSI->csrflags | 1;
  }
  fts5CsrNewrow(in_RSI);
  return iVar1;
}

Assistant:

static int fts5CursorFirst(Fts5FullTable *pTab, Fts5Cursor *pCsr, int bDesc){
  int rc;
  Fts5Expr *pExpr = pCsr->pExpr;
  rc = sqlite3Fts5ExprFirst(pExpr, pTab->p.pIndex, pCsr->iFirstRowid, bDesc);
  if( sqlite3Fts5ExprEof(pExpr) ){
    CsrFlagSet(pCsr, FTS5CSR_EOF);
  }
  fts5CsrNewrow(pCsr);
  return rc;
}